

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_ffh_string_rep(lua_State *L)

{
  uint32_t uVar1;
  long lVar2;
  MSize MVar3;
  GCstr *pGVar4;
  lua_State *L_00;
  ulong lenx;
  char *pcVar5;
  undefined4 *puVar6;
  int iVar7;
  long in_RDI;
  int32_t i_1;
  int32_t i;
  char *buf;
  char *src;
  int64_t tlen;
  global_State *g;
  int32_t len;
  GCstr *sep;
  int32_t k;
  GCstr *s;
  SBuf *in_stack_ffffffffffffff28;
  ErrMsg em;
  lua_State *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int iVar8;
  lua_State *in_stack_ffffffffffffff40;
  char *pcVar9;
  GCstr *local_b8;
  long local_b0;
  undefined4 in_stack_ffffffffffffff60;
  int local_8c;
  
  pGVar4 = lj_lib_checkstr(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_8c = lj_lib_checkint((lua_State *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  L_00 = (lua_State *)lj_lib_optstr(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  MVar3 = pGVar4->len;
  lenx = (ulong)*(uint *)(in_RDI + 8);
  if (0 < local_8c) {
    em = (ErrMsg)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    if (L_00 == (lua_State *)0x0) {
      local_b0 = (long)local_8c * (long)(int)MVar3;
      if (0x7fffff00 < local_b0) {
        lj_err_caller(in_stack_ffffffffffffff30,em);
      }
    }
    else {
      local_b0 = (long)(int)MVar3 + (ulong)(L_00->gclist).gcptr32;
      if (0x7fffff00 < local_b0) {
        lj_err_caller(in_stack_ffffffffffffff30,em);
      }
      local_b0 = local_8c * local_b0;
      if (0x7fffff00 < local_b0) {
        lj_err_caller(in_stack_ffffffffffffff30,em);
      }
    }
    if (local_b0 != 0) {
      pcVar5 = lj_str_needbuf(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
      local_b8 = pGVar4 + 1;
      if ((L_00 != (lua_State *)0x0) && (1 < local_8c)) {
        for (iVar8 = 0; iVar8 < (int)MVar3; iVar8 = iVar8 + 1) {
          *pcVar5 = *(char *)((long)&(local_b8->nextgc).gcptr32 + (long)iVar8);
          pcVar5 = pcVar5 + 1;
        }
        uVar1 = (L_00->gclist).gcptr32;
        for (iVar8 = 0; iVar8 < (int)uVar1; iVar8 = iVar8 + 1) {
          *pcVar5 = *(char *)((long)&L_00->base + (long)iVar8);
          pcVar5 = pcVar5 + 1;
        }
        local_b8 = *(GCstr **)(lenx + 0x58);
        MVar3 = pGVar4->len + uVar1;
        local_8c = local_8c + -1;
      }
      do {
        iVar8 = 0;
        pcVar9 = pcVar5;
        do {
          iVar7 = iVar8 + 1;
          pcVar5 = pcVar9 + 1;
          *pcVar9 = *(char *)((long)&(local_b8->nextgc).gcptr32 + (long)iVar8);
          iVar8 = iVar7;
          pcVar9 = pcVar5;
        } while (iVar7 < (int)MVar3);
        local_8c = local_8c + -1;
      } while (0 < local_8c);
      puVar6 = (undefined4 *)(*(long *)(in_RDI + 0x10) + -8);
      pGVar4 = lj_str_new(L_00,(char *)CONCAT44(MVar3,in_stack_ffffffffffffff60),lenx);
      *puVar6 = (int)pGVar4;
      puVar6[1] = 0xfffffffb;
      return 2;
    }
  }
  lVar2 = *(long *)(in_RDI + 0x10);
  *(uint *)(lVar2 + -8) = *(uint *)(in_RDI + 8) + 0x80;
  *(undefined4 *)(lVar2 + -4) = 0xfffffffb;
  return 2;
}

Assistant:

LJLIB_ASM(string_rep)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t k = lj_lib_checkint(L, 2);
  GCstr *sep = lj_lib_optstr(L, 3);
  int32_t len = (int32_t)s->len;
  global_State *g = G(L);
  int64_t tlen;
  const char *src;
  char *buf;
  if (k <= 0) {
  empty:
    setstrV(L, L->base-1, &g->strempty);
    return FFH_RES(1);
  }
  if (sep) {
    tlen = (int64_t)len + sep->len;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
    tlen *= k;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
  } else {
    tlen = (int64_t)k * len;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
  }
  if (tlen == 0) goto empty;
  buf = lj_str_needbuf(L, &g->tmpbuf, (MSize)tlen);
  src = strdata(s);
  if (sep) {
    tlen -= sep->len;  /* Ignore trailing separator. */
    if (k > 1) {  /* Paste one string and one separator. */
      int32_t i;
      i = 0; while (i < len) *buf++ = src[i++];
      src = strdata(sep); len = sep->len;
      i = 0; while (i < len) *buf++ = src[i++];
      src = g->tmpbuf.buf; len += s->len; k--;  /* Now copy that k-1 times. */
    }
  }
  do {
    int32_t i = 0;
    do { *buf++ = src[i++]; } while (i < len);
  } while (--k > 0);
  setstrV(L, L->base-1, lj_str_new(L, g->tmpbuf.buf, (size_t)tlen));
  return FFH_RES(1);
}